

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_short_test.c
# Opt level: O0

void float_to_short_test(void)

{
  uint local_c;
  int k;
  
  printf("\tfloat_to_short_test ............................. ");
  src_float_to_short_array(float_to_short_test::fpos,float_to_short_test::out,0xf);
  local_c = 0;
  while( true ) {
    if (0xe < (int)local_c) {
      src_float_to_short_array(float_to_short_test::fneg,float_to_short_test::out,0xf);
      local_c = 0;
      while( true ) {
        if (0xe < (int)local_c) {
          puts("ok");
          return;
        }
        if (-30000 < float_to_short_test::out[(int)local_c]) break;
        local_c = local_c + 1;
      }
      printf("\n\n\tLine %d : out [%d] == %d\n",0x52,(ulong)local_c,
             (ulong)(uint)(int)float_to_short_test::out[(int)local_c]);
      exit(1);
    }
    if (float_to_short_test::out[(int)local_c] < 30000) break;
    local_c = local_c + 1;
  }
  printf("\n\n\tLine %d : out [%d] == %d\n",0x4a,(ulong)local_c,
         (ulong)(uint)(int)float_to_short_test::out[(int)local_c]);
  exit(1);
}

Assistant:

static void
float_to_short_test (void)
{
	static float fpos [] =
	{	0.95f, 0.99f, 1.0f, 1.01f, 1.1f, 2.0f, 11.1f, 111.1f, 2222.2f, 33333.3f,
		// Some "almost 1" as corner cases
		(float) (32767.0 / 32768.0), (float) ((32767.0 + 0.4) / 32768.0), (float) ((32767. + 0.5) / 32768.0),
		(float) ((32767.0 + 0.6) / 32768.0), (float) ((32767.0 + 0.9) / 32768.0),
		} ;
	static float fneg [] =
	{	-0.95f, -0.99f, -1.0f, -1.01f, -1.1f, -2.0f, -11.1f, -111.1f, -2222.2f, -33333.3f,
		// Some "almost 1" as corner cases
		(float) (-32767.0 / 32768.0), (float) (-(32767.0 + 0.4) / 32768.0), (float) (-(32767.0 + 0.5) / 32768.0),
		(float) (-(32767.0 + 0.6) / 32768.0), (float) (-(32767.0 + 0.9) / 32768.0),
		} ;

	static short out [MAX (ARRAY_LEN (fpos), ARRAY_LEN (fneg))] ;

	int k ;

	printf ("\tfloat_to_short_test ............................. ") ;

	src_float_to_short_array (fpos, out, ARRAY_LEN (fpos)) ;

	for (k = 0 ; k < ARRAY_LEN (fpos) ; k++)
		if (out [k] < 30000)
		{	printf ("\n\n\tLine %d : out [%d] == %d\n", __LINE__, k, out [k]) ;
			exit (1) ;
			} ;

	src_float_to_short_array (fneg, out, ARRAY_LEN (fneg)) ;

	for (k = 0 ; k < ARRAY_LEN (fneg) ; k++)
		if (out [k] > -30000)
		{	printf ("\n\n\tLine %d : out [%d] == %d\n", __LINE__, k, out [k]) ;
			exit (1) ;
			} ;

	puts ("ok") ;

	return ;
}